

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt1.cpp
# Opt level: O1

int __thiscall crnlib::qdxt1::init(qdxt1 *this,EVP_PKEY_CTX *ctx)

{
  mip_desc *pmVar1;
  uint uVar2;
  uint uVar3;
  dxt_pixel_block *pdVar4;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *ppVar5;
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  unkuint9 Var11;
  undefined1 auVar12 [11];
  undefined1 auVar13 [14];
  undefined1 auVar14 [11];
  undefined1 auVar15 [13];
  undefined1 auVar16 [14];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  uint6 uVar21;
  undefined1 auVar22 [16];
  bool bVar23;
  bool bVar24;
  uint uVar25;
  int iVar26;
  crn_thread_id_t cVar27;
  ulong uVar28;
  ulong uVar29;
  void *in_RCX;
  uint uVar30;
  dxt_pixel_block *in_RDX;
  uint e;
  float *pfVar31;
  uint uVar32;
  uint uVar33;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *paVar34;
  int iVar35;
  long lVar36;
  uint uVar37;
  ulong uVar38;
  uint x;
  int iVar39;
  uint uVar40;
  long lVar41;
  uint uVar42;
  undefined4 *puVar43;
  uint uVar44;
  mip_desc *pmVar45;
  long lVar46;
  ushort uVar47;
  float fVar48;
  double dVar49;
  undefined4 *puVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [15];
  double dVar56;
  uint *puVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  color_quad_u8 h;
  training_vec_array *training_vecs;
  color_quad_u8 c [4];
  uint encoding_hist [8];
  color_quad_u8 layout_pixels [64];
  hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
  selector_hash;
  color_quad_u8 chunk_pixels [64];
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_5dc;
  ulong local_5d8;
  ulong local_5d0;
  uint local_5c4;
  uint local_5c0;
  float local_5bc;
  clusterizer<crnlib::vec<6U,_float>_> *local_5b8;
  long local_5b0;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_5a8 [4];
  ulong local_598;
  ulong local_590;
  uint *local_588;
  undefined4 *local_580;
  uint local_574;
  mip_desc *local_570;
  ulong local_568;
  ulong local_560;
  ulong local_558;
  ulong local_550;
  undefined4 *local_548;
  ulong local_540;
  long local_538;
  ulong local_530;
  undefined1 local_528 [16];
  undefined1 local_518 [16];
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_508 [64];
  undefined1 local_408 [4];
  float afStack_404 [5];
  undefined8 local_3f0;
  long local_3c0 [81];
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_138 [66];
  
  clear(this);
  cVar27 = crn_get_current_thread_id();
  this->m_main_thread_id = cVar27;
  this->m_num_blocks = (uint)ctx;
  this->m_pBlocks = in_RDX;
  memcpy(&this->m_params,in_RCX,0x630);
  local_5b8 = &this->m_endpoint_clusterizer;
  vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::reserve
            (&local_5b8->m_training_vecs,(uint)ctx);
  this->m_progress_start = 0;
  this->m_progress_range = 0x4b;
  if (((this->m_params).m_hierarchical == true) && ((this->m_params).m_num_mips != 0)) {
    uVar44 = this->m_num_blocks;
    uVar37 = (this->m_endpoint_clusterizer).m_training_vecs.m_size;
    if (uVar37 != uVar44) {
      if (uVar37 <= uVar44) {
        if ((this->m_endpoint_clusterizer).m_training_vecs.m_capacity < uVar44) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)local_5b8,uVar44,uVar37 + 1 == uVar44,0x1c,
                     vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::object_mover,false);
        }
        auVar22 = _DAT_001b10b0;
        auVar54 = _DAT_001b10a0;
        auVar53 = _DAT_001b1090;
        uVar37 = (this->m_endpoint_clusterizer).m_training_vecs.m_size;
        uVar25 = uVar44 - uVar37;
        if (uVar25 != 0) {
          uVar28 = (ulong)uVar25 * 0x1c - 0x1c >> 2;
          auVar59._8_8_ = 0;
          auVar59._0_8_ = uVar28;
          auVar51._8_4_ = SUB164(auVar59 * ZEXT816(0x4924924924924925),8);
          auVar51._0_8_ = SUB168(auVar59 * ZEXT816(0x4924924924924925),8);
          auVar51._12_4_ = (int)(uVar28 / 0x380000000);
          auVar52._0_8_ = uVar28 / 7;
          auVar52._8_8_ = auVar51._8_8_ >> 1;
          puVar57 = &(this->m_endpoint_clusterizer).m_training_vecs.m_p[(ulong)uVar37 + 3].second;
          uVar29 = 0;
          auVar52 = auVar52 ^ _DAT_001b10b0;
          do {
            auVar58._8_4_ = (int)uVar29;
            auVar58._0_8_ = uVar29;
            auVar58._12_4_ = (int)(uVar29 >> 0x20);
            auVar59 = (auVar58 | auVar54) ^ auVar22;
            iVar26 = auVar52._4_4_;
            if ((bool)(~(auVar59._4_4_ == iVar26 && auVar52._0_4_ < auVar59._0_4_ ||
                        iVar26 < auVar59._4_4_) & 1)) {
              puVar57[-0x15] = 0;
            }
            if ((auVar59._12_4_ != auVar52._12_4_ || auVar59._8_4_ <= auVar52._8_4_) &&
                auVar59._12_4_ <= auVar52._12_4_) {
              puVar57[-0xe] = 0;
            }
            auVar59 = (auVar58 | auVar53) ^ auVar22;
            iVar35 = auVar59._4_4_;
            if (iVar35 <= iVar26 && (iVar35 != iVar26 || auVar59._0_4_ <= auVar52._0_4_)) {
              puVar57[-7] = 0;
              *puVar57 = 0;
            }
            uVar29 = uVar29 + 4;
            puVar57 = puVar57 + 0x1c;
          } while ((uVar28 / 7 + 4 & 0xfffffffffffffffc) != uVar29);
        }
      }
      (this->m_endpoint_clusterizer).m_training_vecs.m_size = uVar44;
    }
    local_518 = (undefined1  [16])0x0;
    local_528 = (undefined1  [16])0x0;
    if ((this->m_params).m_num_mips != 0) {
      pmVar45 = (this->m_params).m_mip_desc;
      local_5c0 = 0x200;
      uVar28 = 0;
      local_548 = &DAT_001df524;
      uVar44 = 0;
      local_570 = pmVar45;
      do {
        local_5d8 = CONCAT44(local_5d8._4_4_,uVar44);
        uVar30 = pmVar45[uVar28].m_block_width;
        uVar3 = pmVar45[uVar28].m_block_height;
        local_5bc = 1.5;
        if (uVar28 != 0) {
          fVar48 = powf(3.1,(float)(uVar28 & 0xffffffff));
          local_5bc = 0.25;
          if (0.25 <= 1.5 / fVar48) {
            local_5bc = 1.5 / fVar48;
          }
        }
        uVar25 = uVar3 + 1;
        uVar37 = 5;
        uVar44 = (uint)local_5d8;
        if (1 < uVar25) {
          local_568 = uVar28;
          pmVar1 = pmVar45 + uVar28;
          uVar2 = uVar30 + 1;
          local_574 = uVar2;
          local_540 = (ulong)(uVar3 * 4 - 1);
          uVar42 = uVar30 * 4 - 1;
          local_550 = (ulong)(uVar2 >> 1);
          uVar29 = (ulong)(uVar25 >> 1);
          local_590 = 0;
          local_598 = 0;
          local_560 = uVar29;
          do {
            local_5c4 = 8;
            bVar23 = 1 < uVar2;
            if (1 < local_574) {
              local_538 = local_598 * 8;
              local_530 = (ulong)(uint)((int)local_598 * 2);
              local_5d8 = 0;
              lVar46 = 0;
              uVar28 = 0;
              do {
                local_558 = uVar28;
                uVar30 = pmVar1->m_first_block;
                uVar3 = pmVar1->m_block_width;
                pdVar4 = this->m_pBlocks;
                paVar34 = local_138;
                lVar36 = 0;
                do {
                  uVar37 = (int)local_538 + (int)lVar36;
                  if ((uint)local_540 <= uVar37) {
                    uVar37 = (uint)local_540;
                  }
                  lVar41 = 0;
                  do {
                    uVar25 = (int)lVar41 + (int)lVar46;
                    if (uVar42 <= uVar25) {
                      uVar25 = uVar42;
                    }
                    paVar34[lVar41] =
                         *(anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
                          ((long)&pdVar4[(uVar25 >> 2) + (uVar37 >> 2) * uVar3 + uVar30].m_pixels[0]
                                  [uVar25 & 3].field_0 + (ulong)((uVar37 & 3) << 4));
                    lVar41 = lVar41 + 1;
                  } while (lVar41 != 8);
                  lVar36 = lVar36 + 1;
                  paVar34 = paVar34 + 8;
                } while (lVar36 != 8);
                pfVar31 = afStack_404 + 1;
                uVar28 = 0;
                local_5b0 = lVar46;
                do {
                  uVar37 = (&DAT_001df7b8)[uVar28 * 5];
                  iVar26 = (&DAT_001df7bc)[uVar28 * 5];
                  if (iVar26 != 0) {
                    uVar25 = (&g_chunk_tile_layouts)[uVar28 * 5] + (&DAT_001df7b4)[uVar28 * 5] * 8;
                    uVar32 = 0;
                    iVar35 = 0;
                    uVar29 = (ulong)uVar37;
                    uVar33 = uVar25;
                    uVar40 = uVar32;
                    do {
                      for (; uVar29 != 0; uVar29 = uVar29 - 1) {
                        local_508[uVar32] = local_138[uVar25];
                        uVar32 = uVar32 + 1;
                        uVar25 = uVar25 + 1;
                      }
                      iVar35 = iVar35 + 1;
                      uVar32 = uVar40 + uVar37;
                      uVar25 = uVar33 + 8;
                      uVar29 = (ulong)uVar37;
                      uVar33 = uVar25;
                      uVar40 = uVar32;
                    } while (iVar35 != iVar26);
                  }
                  uVar37 = iVar26 * uVar37;
                  lVar46 = uVar28 * 0x50;
                  local_5d0 = uVar28;
                  dxt_fast::compress_color_block
                            (uVar37,(color_quad_u8 *)&local_508[0].field_0,
                             (uint *)(local_408 + lVar46),(uint *)(local_408 + lVar46 + 4),
                             (uint8 *)(afStack_404 + uVar28 * 0x14 + 1),false);
                  dxt1_block::get_block_colors
                            ((color_quad_u8 *)&local_5a8[0].field_0,
                             (uint16)*(uint *)(local_408 + lVar46),
                             *(uint16 *)(local_408 + lVar46 + 4));
                  if (uVar37 == 0) {
                    lVar46 = 0;
                  }
                  else {
                    uVar29 = 0;
                    lVar46 = 0;
                    do {
                      uVar38 = (ulong)*(byte *)((long)pfVar31 + uVar29);
                      lVar46 = lVar46 + (ulong)(((uint)local_508[0].c[uVar29 * 4 + 2] -
                                                (uint)local_5a8[0].c[uVar38 * 4 + 2]) *
                                                ((uint)local_508[0].c[uVar29 * 4 + 2] -
                                                (uint)local_5a8[0].c[uVar38 * 4 + 2]) +
                                               ((uint)local_508[0].c[uVar29 * 4 + 1] -
                                               (uint)local_5a8[0].c[uVar38 * 4 + 1]) *
                                               ((uint)local_508[0].c[uVar29 * 4 + 1] -
                                               (uint)local_5a8[0].c[uVar38 * 4 + 1]) +
                                               ((uint)local_508[0].c[uVar29 * 4] -
                                               (uint)local_5a8[0].c[uVar38 * 4]) *
                                               ((uint)local_508[0].c[uVar29 * 4] -
                                               (uint)local_5a8[0].c[uVar38 * 4]));
                      uVar29 = uVar29 + 1;
                    } while (uVar37 != uVar29);
                  }
                  local_3c0[uVar28 * 10] = lVar46;
                  uVar28 = local_5d0 + 1;
                  pfVar31 = pfVar31 + 0x14;
                } while (uVar28 != 9);
                lVar46 = 0;
                puVar50 = (undefined4 *)0xbff0000000000000;
                uVar37 = 0;
                puVar43 = local_548;
                do {
                  local_580 = puVar50;
                  local_5d0 = CONCAT44(local_5d0._4_4_,uVar37);
                  if ((ulong)(uint)(&g_chunk_encodings)[lVar46 * 0x15] == 0) {
                    puVar57 = (uint *)0x0;
                  }
                  else {
                    dVar56 = 0.0;
                    lVar36 = 0;
                    do {
                      lVar41 = local_3c0[(ulong)*(uint *)((long)puVar43 + lVar36) * 10];
                      auVar53._8_4_ = (int)((ulong)lVar41 >> 0x20);
                      auVar53._0_8_ = lVar41;
                      auVar53._12_4_ = 0x45300000;
                      dVar56 = dVar56 + (auVar53._8_8_ - DAT_001b65b0._8_8_) +
                                        ((double)CONCAT44(0x43300000,(int)lVar41) -
                                        (double)DAT_001b65b0);
                      lVar36 = lVar36 + 0x14;
                    } while ((ulong)(uint)(&g_chunk_encodings)[lVar46 * 0x15] * 0x14 != lVar36);
                    puVar57 = (uint *)(dVar56 * 0.0052083334885537624);
                  }
                  if ((double)puVar57 < 0.0) {
                    local_588 = puVar57;
                    dVar56 = sqrt((double)puVar57);
                    puVar57 = local_588;
                  }
                  else {
                    dVar56 = SQRT((double)puVar57);
                  }
                  dVar49 = 999999.0;
                  if (((double)puVar57 != 0.0) || (NAN((double)puVar57))) {
                    dVar56 = log10(255.0 / dVar56);
                    dVar56 = dVar56 * 20.0;
                    dVar49 = 500.0;
                    if (dVar56 <= 500.0) {
                      dVar49 = dVar56;
                    }
                    dVar49 = (double)(~-(ulong)(dVar56 < 0.0) & (ulong)dVar49);
                  }
                  puVar50 = (undefined4 *)
                            (dVar49 - (double)(((float)((&g_chunk_encodings)[lVar46 * 0x15] - 1) /
                                               3.0) * local_5bc + 0.0));
                  uVar37 = (uint)lVar46;
                  if ((double)puVar50 <= (double)local_580) {
                    puVar50 = local_580;
                    uVar37 = (uint)local_5d0;
                  }
                  lVar46 = lVar46 + 1;
                  puVar43 = puVar43 + 0x15;
                } while (lVar46 != 8);
                uVar28 = (ulong)uVar37;
                *(int *)(local_528 + uVar28 * 4) = *(int *)(local_528 + uVar28 * 4) + 1;
                if ((&g_chunk_encodings)[uVar28 * 0x15] != 0) {
                  local_580 = &DAT_001df514 + uVar28 * 0x15;
                  uVar29 = 0;
                  local_588 = &g_chunk_encodings + uVar28 * 0x15;
                  do {
                    puVar57 = local_580 + uVar29 * 5;
                    uVar37 = puVar57[3];
                    if (uVar37 != 0) {
                      uVar25 = puVar57[2];
                      iVar26 = puVar57[1] << 3;
                      uVar28 = 0;
                      uVar33 = 0;
                      do {
                        iVar35 = (int)uVar28;
                        if ((ulong)uVar25 != 0) {
                          uVar32 = *puVar57 + iVar26;
                          uVar38 = (ulong)uVar25;
                          do {
                            local_508[uVar28] = local_138[uVar32];
                            uVar28 = (ulong)((int)uVar28 + 1);
                            uVar32 = uVar32 + 1;
                            uVar38 = uVar38 - 1;
                          } while (uVar38 != 0);
                        }
                        uVar33 = uVar33 + 1;
                        uVar28 = (ulong)(iVar35 + uVar25);
                        iVar26 = iVar26 + 8;
                      } while (uVar33 != uVar37);
                    }
                    local_5d0 = uVar29;
                    dxt_fast::find_representative_colors
                              (uVar37 * puVar57[2],(color_quad_u8 *)&local_508[0].field_0,
                               (color_quad_u8 *)&local_5a8[0].field_0,
                               (color_quad_u8 *)&local_5dc.field_0);
                    iVar26 = (local_5a8[0].m_u32 & 0xff) - (uint)local_5dc.field_0.r;
                    iVar35 = (local_5a8[0].m_u32 >> 8 & 0xff) - (uint)local_5dc.field_0.g;
                    iVar39 = (uint)(byte)local_5a8[0]._2_1_ - (uint)local_5dc.field_0.b;
                    uVar25 = iVar39 * iVar39 + iVar26 * iVar26 + iVar35 * iVar35;
                    uVar37 = (uint)((ulong)uVar25 * 0x68db8bad >> 0x2b);
                    if (7 < uVar37) {
                      uVar37 = 8;
                    }
                    if (uVar25 < 5000) {
                      uVar37 = 1;
                    }
                    if (3 < puVar57[3]) {
                      auVar55 = ZEXT115(local_5dc.field_0.r) << 0x18 |
                                (~DAT_001b65c0._0_15_ & ZEXT115((byte)local_5a8[0]._2_1_) << 0x10 |
                                ZEXT415(local_5a8[0].m_u32) & DAT_001b65c0._0_15_) &
                                DAT_001b65d0._0_15_;
                      Var11 = CONCAT81(SUB158(ZEXT115(0) << 0x40,7),auVar55[3]);
                      auVar17._9_6_ = 0;
                      auVar17._0_9_ = Var11;
                      auVar12._1_10_ = SUB1510(auVar17 << 0x30,5);
                      auVar12[0] = auVar55[2];
                      auVar18._11_4_ = 0;
                      auVar18._0_11_ = auVar12;
                      auVar9[2] = auVar55[1];
                      auVar9._0_2_ = auVar55._0_2_;
                      auVar9._3_12_ = SUB1512(auVar18 << 0x20,3);
                      auVar10._2_13_ = auVar9._2_13_;
                      auVar10._0_2_ = auVar55._0_2_ & 0xff;
                      auVar6._10_2_ = 0;
                      auVar6._0_10_ = auVar10._0_10_;
                      auVar6._12_2_ = (short)Var11;
                      uVar21 = CONCAT42(auVar6._10_4_,auVar12._0_2_);
                      auVar13._6_8_ = 0;
                      auVar13._0_6_ = uVar21;
                      auVar8._4_2_ = auVar9._2_2_;
                      auVar8._0_4_ = auVar10._0_4_;
                      auVar8._6_8_ = SUB148(auVar13 << 0x40,6);
                      auVar54._0_4_ = (float)(auVar10._0_4_ & 0xffff);
                      auVar54._4_4_ = (float)auVar8._4_4_;
                      auVar54._8_4_ = (float)(int)uVar21;
                      auVar54._12_4_ = (float)(auVar6._10_4_ >> 0x10);
                      uVar25 = 0;
                      uVar28 = local_590;
                      do {
                        uVar33 = puVar57[1];
                        if ((uVar25 + (int)local_530 + (uVar33 >> 2) < pmVar1->m_block_height) &&
                           (3 < puVar57[2])) {
                          uVar32 = 0;
                          do {
                            iVar26 = (int)local_5d8 + uVar32;
                            if (pmVar1->m_block_width <= iVar26 + (*puVar57 >> 2)) break;
                            uVar40 = iVar26 + ((uVar33 >> 2) + (int)uVar28) * pmVar1->m_block_width
                                              + (*puVar57 >> 2) + pmVar1->m_first_block;
                            ppVar5 = (local_5b8->m_training_vecs).m_p;
                            *(undefined1 (*) [16])ppVar5[uVar40].first.m_s = auVar54;
                            ppVar5[uVar40].first.m_s[4] = (float)local_5dc._1_1_;
                            ppVar5[uVar40].first.m_s[5] = (float)local_5dc._2_1_;
                            (local_5b8->m_training_vecs).m_p[uVar40].second = uVar37;
                            uVar44 = uVar44 + 1;
                            uVar32 = uVar32 + 1;
                          } while (uVar32 < puVar57[2] >> 2);
                        }
                        uVar25 = uVar25 + 1;
                        uVar28 = (ulong)((int)uVar28 + 1);
                      } while (uVar25 < puVar57[3] >> 2);
                    }
                    uVar29 = local_5d0 + 1;
                  } while (uVar29 < *local_588);
                }
                lVar46 = local_5b0;
                bVar24 = true;
                if (local_5c0 <= uVar44) {
                  bVar24 = update_progress(this,uVar44,this->m_num_blocks - 1);
                  local_5c0 = local_5c0 + 0x200;
                }
                uVar29 = local_560;
                if (bVar24 == false) {
                  local_5c4 = 1;
                  break;
                }
                uVar28 = local_558 + 1;
                bVar23 = uVar28 < local_550;
                lVar46 = lVar46 + 8;
                local_5d8 = (ulong)((int)local_5d8 + 2);
              } while (uVar28 != local_550);
            }
            pmVar45 = local_570;
            uVar28 = local_568;
            uVar37 = local_5c4;
            if (bVar23) goto LAB_00143a6a;
            local_598 = local_598 + 1;
            local_590 = (ulong)((int)local_590 + 2);
          } while (local_598 != uVar29);
          uVar37 = 5;
        }
LAB_00143a6a:
        if (uVar37 != 5) {
          if ((uVar37 & 0xd) != 0) {
            return 0;
          }
          break;
        }
        uVar28 = uVar28 + 1;
      } while (uVar28 < (this->m_params).m_num_mips);
    }
  }
  else {
    uVar28 = (ulong)this->m_num_blocks;
    if (this->m_num_blocks != 0) {
      lVar46 = 0;
      uVar29 = 0;
      do {
        if (((uVar29 & 0x1ff) == 0) &&
           (bVar23 = update_progress(this,(uint)uVar29,(int)uVar28 - 1), !bVar23)) {
          return 0;
        }
        dxt_fast::find_representative_colors
                  (0x10,(color_quad_u8 *)((long)&this->m_pBlocks->m_pixels[0][0].field_0 + lVar46),
                   (color_quad_u8 *)&local_138[0].field_0,(color_quad_u8 *)&local_508[0].field_0);
        iVar26 = (local_138[0].m_u32 & 0xff) - (uint)(byte)local_508[0]._0_1_;
        iVar39 = (local_138[0].m_u32 >> 8 & 0xff) - (uint)(byte)local_508[0]._1_1_;
        iVar35 = (uint)(byte)local_138[0]._2_1_ - (uint)(byte)local_508[0]._2_1_;
        uVar37 = iVar35 * iVar35 + iVar26 * iVar26 + iVar39 * iVar39;
        uVar44 = (uint)((ulong)uVar37 * 0x68db8bad >> 0x20);
        uVar30 = uVar44 >> 0xb;
        if (7 < uVar44 >> 0xb) {
          uVar30 = 8;
        }
        if (uVar37 < 5000) {
          uVar30 = 1;
        }
        auVar55 = ZEXT115((byte)local_508[0]._0_1_) << 0x18 |
                  (~DAT_001b65c0._0_15_ & ZEXT115((byte)local_138[0]._2_1_) << 0x10 |
                  ZEXT415(local_138[0].m_u32) & DAT_001b65c0._0_15_) & DAT_001b65d0._0_15_;
        Var11 = CONCAT81(SUB158(ZEXT115(0) << 0x40,7),auVar55[3]);
        auVar19._9_6_ = 0;
        auVar19._0_9_ = Var11;
        auVar14._1_10_ = SUB1510(auVar19 << 0x30,5);
        auVar14[0] = auVar55[2];
        auVar20._11_4_ = 0;
        auVar20._0_11_ = auVar14;
        auVar15._1_12_ = SUB1512(auVar20 << 0x20,3);
        auVar15[0] = auVar55[1];
        uVar47 = CONCAT11(0,auVar55[0]);
        auVar55._2_13_ = auVar15;
        auVar55._0_2_ = uVar47;
        auVar7._10_2_ = 0;
        auVar7._0_10_ = auVar55._0_10_;
        auVar7._12_2_ = (short)Var11;
        uVar21 = CONCAT42(auVar7._10_4_,auVar14._0_2_);
        auVar16._6_8_ = 0;
        auVar16._0_6_ = uVar21;
        _local_408 = (raw_node *)
                     CONCAT44((float)(int)CONCAT82(SUB148(auVar16 << 0x40,6),auVar15._0_2_),
                              (float)uVar47);
        afStack_404[2] = (float)(auVar7._10_4_ >> 0x10);
        afStack_404[1] = (float)(int)uVar21;
        afStack_404[3] = (float)(byte)local_508[0]._1_1_;
        afStack_404[4] = (float)(byte)local_508[0]._2_1_;
        clusterizer<crnlib::vec<6U,_float>_>::add_training_vec
                  (local_5b8,(vec<6U,_float> *)local_408,uVar30);
        uVar29 = uVar29 + 1;
        uVar28 = (ulong)this->m_num_blocks;
        lVar46 = lVar46 + 0x40;
      } while (uVar29 < uVar28);
    }
  }
  this->m_progress_start = 0x4b;
  this->m_progress_range = 0x14;
  uVar44 = 0;
  bVar23 = clusterizer<crnlib::vec<6U,_float>_>::generate_codebook
                     (local_5b8,0xffff,generate_codebook_progress_callback,this,false);
  if (bVar23) {
    _local_408 = (raw_node *)0x0;
    afStack_404[1] = 0.0;
    afStack_404[2] = 0.0;
    afStack_404[3] = 4.48416e-44;
    local_3f0._0_4_ = 0;
    local_3f0._4_4_ = 0;
    this->m_progress_start = 0x5f;
    this->m_progress_range = 5;
    uVar28 = (ulong)this->m_num_blocks;
    bVar23 = this->m_num_blocks == 0;
    if (!bVar23) {
      lVar46 = 0;
      uVar29 = 0;
      do {
        if (((uVar29 & 0x1ff) == 0) &&
           (bVar24 = update_progress(this,(uint)uVar29,(int)uVar28 - 1), !bVar24))
        goto LAB_00143d24;
        dxt_fast::compress_color_block
                  ((dxt1_block *)&local_508[0].field_0,
                   (color_quad_u8 *)((long)&this->m_pBlocks->m_pixels[0][0].field_0 + lVar46),false)
        ;
        local_528._0_4_ = local_508[1];
        hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
        ::insert((insert_result *)&local_138[0].field_0,
                 (hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                  *)local_408,(uint *)local_528,(empty_type *)&local_5a8[0].field_0);
        uVar29 = uVar29 + 1;
        uVar28 = (ulong)this->m_num_blocks;
        lVar46 = lVar46 + 0x40;
        bVar23 = uVar29 >= uVar28;
      } while (uVar29 < uVar28);
    }
    this->m_max_selector_clusters = (uint)local_3f0 + 0x80;
    update_progress(this,1,1);
LAB_00143d24:
    uVar44 = (uint)bVar23;
    if (afStack_404[1] != 0.0) {
      if (_local_408 != (raw_node *)0x0) {
        crnlib_free(_local_408);
        _local_408 = (raw_node *)0x0;
        afStack_404[1] = 0.0;
        afStack_404[2] = 0.0;
      }
      afStack_404[3] = 4.48416e-44;
      local_3f0._0_4_ = 0;
      local_3f0._4_4_ = 0;
    }
    if (_local_408 != (raw_node *)0x0) {
      crnlib_free(_local_408);
    }
  }
  return uVar44;
}

Assistant:

bool qdxt1::init(uint n, const dxt_pixel_block* pBlocks, const qdxt1_params& params) {
  clear();

  CRNLIB_ASSERT(n && pBlocks);

  m_main_thread_id = crn_get_current_thread_id();

  m_num_blocks = n;
  m_pBlocks = pBlocks;
  m_params = params;

  m_endpoint_clusterizer.reserve_training_vecs(m_num_blocks);

  m_progress_start = 0;
  m_progress_range = 75;

  const bool debugging = false;
  image_u8 debug_img;

  if ((m_params.m_hierarchical) && (m_params.m_num_mips)) {
    vec6F_clusterizer::training_vec_array& training_vecs = m_endpoint_clusterizer.get_training_vecs();
    training_vecs.resize(m_num_blocks);

    uint encoding_hist[cNumChunkEncodings];
    utils::zero_object(encoding_hist);

    uint total_processed_blocks = 0;
    uint next_progress_threshold = 512;

    for (uint level = 0; level < m_params.m_num_mips; level++) {
      const qdxt1_params::mip_desc& level_desc = m_params.m_mip_desc[level];

      const uint num_chunks_x = (level_desc.m_block_width + cChunkBlockWidth - 1) / cChunkBlockWidth;
      const uint num_chunks_y = (level_desc.m_block_height + cChunkBlockHeight - 1) / cChunkBlockHeight;

      const uint level_width = level_desc.m_block_width * 4;
      const uint level_height = level_desc.m_block_height * 4;

      if (debugging)
        debug_img.resize(num_chunks_x * cChunkPixelWidth, num_chunks_y * cChunkPixelHeight);

      float adaptive_tile_color_psnr_derating = 1.5f;  // was 2.4f
      if ((level) && (adaptive_tile_color_psnr_derating > .25f)) {
        adaptive_tile_color_psnr_derating = math::maximum(.25f, adaptive_tile_color_psnr_derating / powf(3.1f, static_cast<float>(level)));  // was 3.0f
      }
      for (uint chunk_y = 0; chunk_y < num_chunks_y; chunk_y++) {
        for (uint chunk_x = 0; chunk_x < num_chunks_x; chunk_x++) {
          color_quad_u8 chunk_pixels[cChunkPixelWidth * cChunkPixelHeight];

          for (uint y = 0; y < cChunkPixelHeight; y++) {
            const uint pix_y = math::minimum<uint>(chunk_y * cChunkPixelHeight + y, level_height - 1);

            const uint outer_block_index = level_desc.m_first_block + ((pix_y >> 2) * level_desc.m_block_width);

            for (uint x = 0; x < cChunkPixelWidth; x++) {
              const uint pix_x = math::minimum<uint>(chunk_x * cChunkPixelWidth + x, level_width - 1);

              const uint block_index = outer_block_index + (pix_x >> 2);

              const dxt_pixel_block& block = m_pBlocks[block_index];

              const color_quad_u8& p = block.m_pixels[pix_y & 3][pix_x & 3];

              chunk_pixels[x + y * 8] = p;
            }
          }

          struct layout_results {
            uint m_low_color;
            uint m_high_color;
            uint8 m_selectors[cChunkPixelWidth * cChunkPixelHeight];
            uint64 m_error;
            //float m_penalty;
          };
          layout_results layouts[cNumChunkTileLayouts];

          for (uint l = 0; l < cNumChunkTileLayouts; l++) {
            const uint width = g_chunk_tile_layouts[l].m_width;
            const uint height = g_chunk_tile_layouts[l].m_height;
            const uint x_ofs = g_chunk_tile_layouts[l].m_x_ofs;
            const uint y_ofs = g_chunk_tile_layouts[l].m_y_ofs;

            color_quad_u8 layout_pixels[cChunkPixelWidth * cChunkPixelHeight];
            for (uint y = 0; y < height; y++)
              for (uint x = 0; x < width; x++)
                layout_pixels[x + y * width] = chunk_pixels[(x_ofs + x) + (y_ofs + y) * cChunkPixelWidth];

            const uint n = width * height;
            dxt_fast::compress_color_block(n, layout_pixels, layouts[l].m_low_color, layouts[l].m_high_color, layouts[l].m_selectors);

            color_quad_u8 c[4];
            dxt1_block::get_block_colors(c, static_cast<uint16>(layouts[l].m_low_color), static_cast<uint16>(layouts[l].m_high_color));

            uint64 error = 0;
            for (uint i = 0; i < n; i++)
              error += color::elucidian_distance(layout_pixels[i], c[layouts[l].m_selectors[i]], false);

            layouts[l].m_error = error;

#if 0
                     if ((width > 4) || (height > 4))
                     {
                        const uint dist = color::elucidian_distance(
                           dxt1_block::unpack_color(static_cast<uint16>(layouts[l].m_low_color), true),
                           dxt1_block::unpack_color(static_cast<uint16>(layouts[l].m_high_color), true), false);

                        layouts[l].m_penalty = math::clamp((sqrt((float)dist) - 75.0f) / 150.0f, 0.0f, 2.0f);
                        if ((width == 8) && (height == 8))
                           layouts[l].m_penalty *= 2.0f;
                     }
                     else
                     {
                        layouts[l].m_penalty = 0.0f;
                     }
#endif
          }

          double best_peak_snr = -1.0f;
          uint best_encoding = 0;

          for (uint e = 0; e < cNumChunkEncodings; e++) {
            const chunk_encoding_desc& encoding_desc = g_chunk_encodings[e];

            double total_error = 0;

            for (uint t = 0; t < encoding_desc.m_num_tiles; t++)
              total_error += (double)layouts[encoding_desc.m_tiles[t].m_layout_index].m_error;

            //double mean_squared = total_error * (1.0f / (16.0f * 3.0f));
            double mean_squared = total_error * (1.0f / (64.0f * 3.0f));
            double root_mean_squared = sqrt(mean_squared);

            double peak_snr = 999999.0f;
            if (mean_squared)
              peak_snr = math::clamp<double>(log10(255.0f / root_mean_squared) * 20.0f, 0.0f, 500.0f);

            //if (level)
            //   adaptive_tile_color_psnr_derating = math::lerp(adaptive_tile_color_psnr_derating * .5f, .3f, math::maximum((level - 1) / float(m_params.m_num_mips - 2), 1.0f));

            float color_derating = math::lerp(0.0f, adaptive_tile_color_psnr_derating, (g_chunk_encodings[e].m_num_tiles - 1) / 3.0f);
            peak_snr = peak_snr - color_derating;

            //for (uint t = 0; t < encoding_desc.m_num_tiles; t++)
            //   peak_snr -= (double)layouts[encoding_desc.m_tiles[t].m_layout_index].m_penalty;

            if (peak_snr > best_peak_snr) {
              best_peak_snr = peak_snr;
              best_encoding = e;
            }
          }

          encoding_hist[best_encoding]++;

          const chunk_encoding_desc& encoding_desc = g_chunk_encodings[best_encoding];

          for (uint t = 0; t < encoding_desc.m_num_tiles; t++) {
            const chunk_tile_desc& tile_desc = encoding_desc.m_tiles[t];

            uint layout_index = tile_desc.m_layout_index;
            const layout_results& layout = layouts[layout_index];
            color_quad_u8 c[4];
            if (debugging)
              dxt1_block::get_block_colors(c, static_cast<uint16>(layout.m_low_color), static_cast<uint16>(layout.m_high_color));

            color_quad_u8 tile_pixels[cChunkPixelWidth * cChunkPixelHeight];

            for (uint y = 0; y < tile_desc.m_height; y++) {
              const uint pix_y = y + tile_desc.m_y_ofs;

              for (uint x = 0; x < tile_desc.m_width; x++) {
                const uint pix_x = x + tile_desc.m_x_ofs;

                tile_pixels[x + y * tile_desc.m_width] = chunk_pixels[pix_x + pix_y * cChunkPixelWidth];

                if (debugging)
                  debug_img(chunk_x * 8 + pix_x, chunk_y * 8 + pix_y) = c[layout.m_selectors[x + y * tile_desc.m_width]];
              }
            }

            color_quad_u8 l, h;
            dxt_fast::find_representative_colors(tile_desc.m_width * tile_desc.m_height, tile_pixels, l, h);

            //const uint dist = color::color_distance(m_params.m_perceptual, l, h, false);
            const uint dist = color::elucidian_distance(l, h, false);

            const uint cColorDistToWeight = 5000;
            const uint cMaxWeight = 8;
            uint weight = math::clamp<uint>(dist / cColorDistToWeight, 1, cMaxWeight);

            vec6F ev;

            ev[0] = l[0];
            ev[1] = l[1];
            ev[2] = l[2];
            ev[3] = h[0];
            ev[4] = h[1];
            ev[5] = h[2];

            for (uint y = 0; y < (tile_desc.m_height >> 2); y++) {
              uint block_y = chunk_y * cChunkBlockHeight + y + (tile_desc.m_y_ofs >> 2);
              if (block_y >= level_desc.m_block_height)
                continue;

              for (uint x = 0; x < (tile_desc.m_width >> 2); x++) {
                uint block_x = chunk_x * cChunkBlockWidth + x + (tile_desc.m_x_ofs >> 2);
                if (block_x >= level_desc.m_block_width)
                  break;

                uint block_index = level_desc.m_first_block + block_x + block_y * level_desc.m_block_width;

                training_vecs[block_index].first = ev;
                training_vecs[block_index].second = weight;

                total_processed_blocks++;

                //if (debugging)
                //{
                //   debug_img(block_x, block_y) = l;
                //   debug_img(block_x + level_desc.m_block_width, block_y) = h;
                //}

              }  // x
            }    // y
          }      //t

          if (total_processed_blocks >= next_progress_threshold) {
            next_progress_threshold += 512;

            if (!update_progress(total_processed_blocks, m_num_blocks - 1))
              return false;
          }

        }  // chunk_x
      }    // chunk_y

#if GENERATE_DEBUG_IMAGES
      if (debugging)
        image_utils::write_to_file(dynamic_string(cVarArg, "debug_%u.tga", level).get_ptr(), debug_img, image_utils::cWriteFlagIgnoreAlpha);
#endif

    }  // level

#if 0
         trace("chunk encoding hist: ");
         for (uint i = 0; i < cNumChunkEncodings; i++)
            trace("%u ", encoding_hist[i]);
         trace("\n");
#endif
  } else {
    for (uint block_index = 0; block_index < m_num_blocks; block_index++) {
      if ((block_index & 511) == 0) {
        if (!update_progress(block_index, m_num_blocks - 1))
          return false;
      }

      color_quad_u8 l, h;
      dxt_fast::find_representative_colors(cDXTBlockSize * cDXTBlockSize, &m_pBlocks[block_index].m_pixels[0][0], l, h);

      //const uint dist = color::color_distance(m_params.m_perceptual, l, h, false);
      const uint dist = color::elucidian_distance(l, h, false);

      const uint cColorDistToWeight = 5000;
      const uint cMaxWeight = 8;
      uint weight = math::clamp<uint>(dist / cColorDistToWeight, 1, cMaxWeight);

      vec6F ev;

      ev[0] = l[0];
      ev[1] = l[1];
      ev[2] = l[2];
      ev[3] = h[0];
      ev[4] = h[1];
      ev[5] = h[2];

      m_endpoint_clusterizer.add_training_vec(ev, weight);
    }
  }

  const uint cMaxEndpointClusters = 65535U;

  m_progress_start = 75;
  m_progress_range = 20;

  if (!m_endpoint_clusterizer.generate_codebook(cMaxEndpointClusters, generate_codebook_progress_callback, this))
    return false;

  crnlib::hash_map<uint, empty_type> selector_hash;

  m_progress_start = 95;
  m_progress_range = 5;

  for (uint block_index = 0; block_index < m_num_blocks; block_index++) {
    if ((block_index & 511) == 0) {
      if (!update_progress(block_index, m_num_blocks - 1))
        return false;
    }

    dxt1_block dxt_blk;
    dxt_fast::compress_color_block(&dxt_blk, &m_pBlocks[block_index].m_pixels[0][0]);

    uint selectors = dxt_blk.m_selectors[0] | (dxt_blk.m_selectors[1] << 8) | (dxt_blk.m_selectors[2] << 16) | (dxt_blk.m_selectors[3] << 24);

    selector_hash.insert(selectors);
  }

  m_max_selector_clusters = selector_hash.size() + 128;

  //      trace("max endpoint clusters: %u\n", m_endpoint_clusterizer.get_codebook_size());
  //      trace("max selector clusters: %u\n", m_max_selector_clusters);

  update_progress(1, 1);

  return true;
}